

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf_exporter.cpp
# Opt level: O2

unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> make_alf_file(fitting_result *data)

{
  uint uVar1;
  long lVar2;
  ltc_store_data *plVar3;
  long lVar4;
  uint uVar5;
  fitting_result *in_RSI;
  ulong uVar6;
  int alpha;
  int iVar7;
  uint uVar8;
  
  std::make_unique<alf::alf_file>();
  **(undefined4 **)data = 0x464c41;
  uVar5 = in_RSI->num_samples_angle;
  lVar4 = *(long *)data;
  *(uint *)(lVar4 + 8) = uVar5;
  uVar8 = in_RSI->num_samples_roughness;
  *(uint *)(lVar4 + 0xc) = uVar8;
  *(undefined4 *)(lVar4 + 4) = 1;
  iVar7 = uVar8 * uVar5;
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)(lVar4 + 0x10),(ulong)(uint)(iVar7 * 4));
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)(*(long *)data + 0x28),
             (ulong)(uint)(iVar7 * 3));
  lVar4._0_4_ = data->num_samples_angle;
  lVar4._4_4_ = data->num_samples_roughness;
  for (uVar5 = 0; uVar5 < *(uint *)(lVar4 + 8); uVar5 = uVar5 + 1) {
    for (uVar8 = 0; uVar1 = *(uint *)(lVar4 + 0xc), uVar8 < uVar1; uVar8 = uVar8 + 1) {
      plVar3 = fitting_result::getData(in_RSI,uVar5,uVar8);
      iVar7 = uVar1 * uVar5 + uVar8;
      uVar6 = (ulong)(uint)(iVar7 * 4);
      lVar4 = *(long *)data;
      lVar2 = *(long *)(lVar4 + 0x10);
      *(float *)(lVar2 + uVar6 * 4) = (plVar3->matrix_parameters)._M_elems[0];
      *(float *)(lVar2 + 4 + uVar6 * 4) = (plVar3->matrix_parameters)._M_elems[1];
      *(float *)(lVar2 + 8 + uVar6 * 4) = (plVar3->matrix_parameters)._M_elems[2];
      *(float *)(lVar2 + 0xc + uVar6 * 4) = (plVar3->matrix_parameters)._M_elems[3];
      lVar2 = *(long *)(lVar4 + 0x28);
      *(float *)(lVar2 + (ulong)(uint)(iVar7 * 3) * 4) = (plVar3->matrix_parameters)._M_elems[4];
      *(float *)(lVar2 + (ulong)(iVar7 * 3 + 1) * 4) = plVar3->distribution_norm;
      *(float *)(lVar2 + (ulong)(iVar7 * 3 + 2) * 4) = plVar3->fresnel_term;
    }
  }
  return (__uniq_ptr_data<alf::alf_file,_std::default_delete<alf::alf_file>,_true,_true>)
         (__uniq_ptr_data<alf::alf_file,_std::default_delete<alf::alf_file>,_true,_true>)data;
}

Assistant:

std::unique_ptr<alf::alf_file> make_alf_file(const fitting_result &data)
{
  auto file = std::make_unique<alf::alf_file>();

  std::strcpy(file->header.id, "ALF");
  file->header.num_samples_angle = data.num_samples_angle;
  file->header.num_samples_roughness = data.num_samples_roughness;
  file->header.version_major = 1;
  file->header.version_minor = 0;

  auto num_samples = file->header.num_samples_angle * file->header.num_samples_roughness;
  file->texture_slot1.resize(4 * num_samples);
  file->texture_slot2.resize(3 * num_samples);

  for (auto theta = 0; theta < file->header.num_samples_angle; ++theta)
  {
    for (auto alpha = 0; alpha < file->header.num_samples_roughness; ++alpha)
    {
      auto matrix_index = file->header.num_samples_roughness * theta + alpha;
      auto base_tex1 = 4 * matrix_index;
      auto base_tex2 = 3 * matrix_index;

      const auto& params = data.getData(theta, alpha);

      file->texture_slot1[base_tex1+0] = params.matrix_parameters[0];
      file->texture_slot1[base_tex1+1] = params.matrix_parameters[1];
      file->texture_slot1[base_tex1+2] = params.matrix_parameters[2];
      file->texture_slot1[base_tex1+3] = params.matrix_parameters[3];

      file->texture_slot2[base_tex2+0] = params.matrix_parameters[4];
      file->texture_slot2[base_tex2+1] = params.distribution_norm;
      file->texture_slot2[base_tex2+2] = params.fresnel_term;
    }
  }

  return file;
}